

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  ushort uVar1;
  ushort uVar2;
  MemPage *pPage;
  u8 *puVar3;
  int iVar4;
  uint uVar5;
  Pgno *pPVar6;
  long lVar7;
  u32 uVar8;
  undefined8 uVar9;
  uchar *puVar10;
  uint uVar11;
  uchar *puVar12;
  uint uVar13;
  uchar *puVar14;
  Pgno nextPage;
  DbPage *pDbPage;
  uint local_60;
  int local_5c;
  size_t local_58;
  uchar *local_50;
  BtShared *local_48;
  int local_3c;
  DbPage *local_38;
  
  pPage = pCur->apPage[pCur->iPage];
  local_48 = pCur->pBt;
  local_5c = eOp;
  if ((pCur->info).nSize == 0) {
    btreeParseCellPtr(pPage,pPage->aData +
                            (CONCAT11(pPage->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2],
                                      pPage->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2 + 1]) &
                            pPage->maskPage),&pCur->info);
    pCur->validNKey = '\x01';
  }
  iVar4 = 0;
  if (pPage->intKey == '\0') {
    iVar4 = (int)(pCur->info).nKey;
  }
  uVar9 = 0xd11c;
  if (amt + offset <= iVar4 + (pCur->info).nData) {
    uVar1 = (pCur->info).nHeader;
    puVar3 = (pCur->info).pCell;
    uVar2 = (pCur->info).nLocal;
    local_50 = pBuf;
    if (puVar3 + (ulong)uVar2 + (ulong)uVar1 <= pPage->aData + local_48->usableSize) {
      uVar13 = (uint)uVar2;
      if (uVar13 < offset || uVar13 - offset == 0) {
        uVar13 = offset - uVar13;
        iVar4 = 0;
      }
      else {
        uVar8 = uVar13 - offset;
        if (amt + offset <= (uint)uVar2) {
          uVar8 = amt;
        }
        local_58 = (size_t)(int)uVar8;
        puVar10 = puVar3 + (ulong)offset + (ulong)uVar1;
        if ((local_5c == 0) ||
           (iVar4 = sqlite3PagerWrite(pPage->pDbPage), puVar10 = local_50,
           pBuf = puVar3 + (ulong)offset + (ulong)uVar1, puVar12 = local_50, iVar4 == 0)) {
          puVar12 = local_50;
          memcpy(pBuf,puVar10,local_58);
          iVar4 = 0;
        }
        local_50 = puVar12 + local_58;
        amt = amt - (int)local_58;
        uVar13 = 0;
      }
      if ((iVar4 == 0) && (amt != 0)) {
        uVar11 = local_48->usableSize - 4;
        uVar2 = (pCur->info).nLocal;
        uVar5 = *(uint *)(puVar3 + (ulong)uVar2 + (ulong)uVar1);
        local_60 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        iVar4 = 0;
        local_58 = CONCAT44(local_58._4_4_,uVar11);
        if ((pCur->isIncrblobHandle != '\0') && (pCur->aOverflow == (Pgno *)0x0)) {
          uVar5 = ((local_48->usableSize - (uint)uVar2) + (pCur->info).nPayload) - 5;
          iVar4 = uVar5 / uVar11 << 2;
          pPVar6 = (Pgno *)sqlite3Malloc(iVar4);
          if (pPVar6 != (Pgno *)0x0) {
            memset(pPVar6,0,(long)iVar4);
          }
          iVar4 = 7;
          if (uVar5 < (uint)local_58) {
            iVar4 = 0;
          }
          pCur->aOverflow = pPVar6;
          uVar11 = (uint)local_58;
          if (pPVar6 != (Pgno *)0x0) {
            iVar4 = 0;
          }
        }
        pPVar6 = pCur->aOverflow;
        lVar7 = 0;
        if (pPVar6 != (Pgno *)0x0) {
          if (pPVar6[(ulong)uVar13 / (ulong)uVar11] != 0) {
            lVar7 = (long)(int)((ulong)uVar13 / (ulong)uVar11);
            local_60 = pPVar6[lVar7];
            uVar13 = uVar13 % uVar11;
          }
        }
        if (local_60 != 0 && iVar4 == 0) {
          local_3c = (uint)(local_5c == 0) * 2;
          lVar7 = lVar7 * 4;
          do {
            pPVar6 = pCur->aOverflow;
            if (pPVar6 != (Pgno *)0x0) {
              *(uint *)((long)pPVar6 + lVar7) = local_60;
            }
            uVar5 = uVar13 - uVar11;
            if (uVar13 < uVar11) {
              uVar8 = uVar11 - uVar13;
              if (amt + uVar13 <= uVar11) {
                uVar8 = amt;
              }
              iVar4 = sqlite3PagerAcquire(local_48->pPager,local_60,&local_38,local_3c);
              if (iVar4 == 0) {
                puVar14 = (uchar *)((ulong)(uVar13 + 4) + (long)local_38->pData);
                uVar13 = *local_38->pData;
                local_60 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                           uVar13 << 0x18;
                puVar10 = puVar14;
                puVar12 = local_50;
                if ((local_5c == 0) ||
                   (iVar4 = sqlite3PagerWrite(local_38), puVar10 = local_50, puVar12 = puVar14,
                   iVar4 == 0)) {
                  memcpy(puVar12,puVar10,(long)(int)uVar8);
                  iVar4 = 0;
                }
                sqlite3PagerUnref(local_38);
                uVar13 = 0;
              }
              amt = amt - uVar8;
              local_50 = local_50 + (int)uVar8;
              uVar11 = (uint)local_58;
            }
            else {
              uVar13 = uVar5;
              if ((pPVar6 == (Pgno *)0x0) ||
                 (uVar5 = *(uint *)((long)pPVar6 + lVar7 + 4), uVar5 == 0)) {
                iVar4 = getOverflowPage(local_48,local_60,(MemPage **)0x0,&local_60);
                uVar11 = (uint)local_58;
              }
              else {
                iVar4 = 0;
                local_60 = uVar5;
              }
            }
          } while (((iVar4 == 0) && (amt != 0)) && (lVar7 = lVar7 + 4, local_60 != 0));
        }
      }
      if (iVar4 != 0) {
        return iVar4;
      }
      uVar9 = 0xd1a4;
      if (amt == 0) {
        return 0;
      }
    }
  }
  sqlite3_log(0xb,"database corruption at line %d of [%.10s]",uVar9,
              "118a3b35693b134d56ebd780123b7fd6f1497668");
  return 0xb;
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */ 
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  u32 nKey;
  int iIdx = 0;
  MemPage *pPage = pCur->apPage[pCur->iPage]; /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */

  assert( pPage );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->aiIdx[pCur->iPage]<pPage->nCell );
  assert( cursorHoldsMutex(pCur) );

  getCellInfo(pCur);
  aPayload = pCur->info.pCell + pCur->info.nHeader;
  nKey = (pPage->intKey ? 0 : (int)pCur->info.nKey);

  if( NEVER(offset+amt > nKey+pCur->info.nData) 
   || &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize]
  ){
    /* Trying to read or write past the end of the data is an error */
    return SQLITE_CORRUPT_BKPT;
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, eOp, pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }

  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

#ifndef SQLITE_OMIT_INCRBLOB
    /* If the isIncrblobHandle flag is set and the BtCursor.aOverflow[]
    ** has not been allocated, allocate it now. The array is sized at
    ** one entry for each overflow page in the overflow chain. The
    ** page number of the first overflow page is stored in aOverflow[0],
    ** etc. A value of 0 in the aOverflow[] array means "not yet known"
    ** (the cache is lazily populated).
    */
    if( pCur->isIncrblobHandle && !pCur->aOverflow ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      pCur->aOverflow = (Pgno *)sqlite3MallocZero(sizeof(Pgno)*nOvfl);
      /* nOvfl is always positive.  If it were zero, fetchPayload would have
      ** been used instead of this routine. */
      if( ALWAYS(nOvfl) && !pCur->aOverflow ){
        rc = SQLITE_NOMEM;
      }
    }

    /* If the overflow page-list cache has been allocated and the
    ** entry for the first required overflow page is valid, skip
    ** directly to it.
    */
    if( pCur->aOverflow && pCur->aOverflow[offset/ovflSize] ){
      iIdx = (offset/ovflSize);
      nextPage = pCur->aOverflow[iIdx];
      offset = (offset%ovflSize);
    }
#endif

    for( ; rc==SQLITE_OK && amt>0 && nextPage; iIdx++){

#ifndef SQLITE_OMIT_INCRBLOB
      /* If required, populate the overflow page-list cache. */
      if( pCur->aOverflow ){
        assert(!pCur->aOverflow[iIdx] || pCur->aOverflow[iIdx]==nextPage);
        pCur->aOverflow[iIdx] = nextPage;
      }
#endif

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        */
#ifndef SQLITE_OMIT_INCRBLOB
        if( pCur->aOverflow && pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        } else 
#endif
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
        sqlite3_file *fd;
#endif
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and 
        **   2) data is required from the start of this overflow page, and
        **   3) the database is file-backed, and
        **   4) there is no open write-transaction, and
        **   5) the database is not a WAL database,
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( eOp==0                                             /* (1) */
         && offset==0                                          /* (2) */
         && pBt->inTransaction==TRANS_READ                     /* (4) */
         && (fd = sqlite3PagerFile(pBt->pPager))->pMethods     /* (3) */
         && pBt->pPage1->aData[19]==0x01                       /* (5) */
        ){
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerAcquire(pBt->pPager, nextPage, &pDbPage,
              (eOp==0 ? PAGER_ACQUIRE_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, eOp, pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        pBuf += a;
      }
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    return SQLITE_CORRUPT_BKPT;
  }
  return rc;
}